

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

bool decodeImmediateSize(char **encoding,MipsImmediateType *dest)

{
  MipsImmediateType MVar1;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  
  pbVar3 = (byte *)*encoding;
  bVar4 = *pbVar3;
  if (bVar4 == 0x68) {
    *encoding = (char *)(pbVar3 + 1);
    MVar1 = ImmediateHalfFloat;
  }
  else {
    iVar2 = 0;
    if (9 < (byte)(bVar4 - 0x30)) {
      return false;
    }
    do {
      pbVar3 = pbVar3 + 1;
      iVar2 = (uint)bVar4 + iVar2 * 10 + -0x30;
      *encoding = (char *)pbVar3;
      bVar4 = *pbVar3;
    } while ((byte)(bVar4 - 0x30) < 10);
    if (iVar2 < 0x10) {
      if (iVar2 == 5) {
        MVar1 = Immediate5;
      }
      else if (iVar2 == 7) {
        MVar1 = Immediate7;
      }
      else {
        if (iVar2 != 10) {
          return false;
        }
        MVar1 = Immediate10;
      }
    }
    else if (iVar2 < 0x19) {
      if (iVar2 == 0x10) {
        MVar1 = Immediate16;
      }
      else {
        if (iVar2 != 0x14) {
          return false;
        }
        MVar1 = Immediate20;
      }
    }
    else if (iVar2 == 0x19) {
      MVar1 = Immediate25;
    }
    else {
      if (iVar2 != 0x1a) {
        return false;
      }
      MVar1 = Immediate26;
    }
  }
  *dest = MVar1;
  return true;
}

Assistant:

static bool decodeImmediateSize(const char*& encoding, MipsImmediateType& dest)
{
	if (*encoding == 'h')	// half float
	{
		encoding++;
		dest = MipsImmediateType::ImmediateHalfFloat;
	} else {
		int num = 0;
		while (*encoding >= '0' && *encoding <= '9')
		{
			num = num*10 + *encoding-'0';
			encoding++;
		}

		switch (num)
		{
		case 5:
			dest = MipsImmediateType::Immediate5;
			break;
		case 7:
			dest = MipsImmediateType::Immediate7;
			break;
		case 10:
			dest = MipsImmediateType::Immediate10;
			break;
		case 16:
			dest = MipsImmediateType::Immediate16;
			break;
		case 20:
			dest = MipsImmediateType::Immediate20;
			break;
		case 25:
			dest = MipsImmediateType::Immediate25;
			break;
		case 26:
			dest = MipsImmediateType::Immediate26;
			break;
		default:
			return false;
		}
	}

	return true;
}